

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O1

void __thiscall QtPrivate::ExceptionStore::setException(ExceptionStore *this,exception_ptr e)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = *e._M_exception_object;
  if (pvVar2 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  pvVar3 = (this->exceptionHolder)._M_exception_object;
  (this->exceptionHolder)._M_exception_object = pvVar2;
  if (pvVar3 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ExceptionStore::setException(std::exception_ptr e)
{
    Q_ASSERT(!hasException());
    exceptionHolder = e;
}